

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::values::detail::SignedCheck<int,true>::operator()
          (SignedCheck<int,true> *this,bool negative,uint u,string *text)

{
  uint uVar1;
  string *text_local;
  uint u_local;
  bool negative_local;
  SignedCheck<int,_true> *this_local;
  
  if (negative) {
    uVar1 = std::numeric_limits<int>::min();
    if (uVar1 < u) {
      throw_or_mimic<cxxopts::argument_incorrect_type>(text);
    }
  }
  else {
    uVar1 = std::numeric_limits<int>::max();
    if (uVar1 < u) {
      throw_or_mimic<cxxopts::argument_incorrect_type>(text);
    }
  }
  return;
}

Assistant:

void
        operator()(bool negative, U u, const std::string& text)
        {
          if (negative)
          {
            if (u > static_cast<U>((std::numeric_limits<T>::min)()))
            {
              throw_or_mimic<argument_incorrect_type>(text);
            }
          }
          else
          {
            if (u > static_cast<U>((std::numeric_limits<T>::max)()))
            {
              throw_or_mimic<argument_incorrect_type>(text);
            }
          }
        }